

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

int lddmc_member_cube(MDD a,uint32_t *values,size_t count)

{
  size_t sVar1;
  
  sVar1 = 0;
  while( true ) {
    if (a == 0) {
      return 0;
    }
    if (a == 1) break;
    if (count == sVar1) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x73b,"int lddmc_member_cube(MDD, uint32_t *, size_t)");
    }
    a = lddmc_follow(a,values[sVar1]);
    sVar1 = sVar1 + 1;
  }
  return 1;
}

Assistant:

int
lddmc_member_cube(MDD a, uint32_t* values, size_t count)
{
    while (1) {
        if (a == lddmc_false) return 0;
        if (a == lddmc_true) return 1;
        if (count <= 0) assert(count > 0); // size mismatch

        a = lddmc_follow(a, *values);
        values++;
        count--;
    }
}